

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O0

void Gia_ManEquivDeriveReprs(Gia_Man_t *p,Gia_Man_t *pNew,Gia_Man_t *pFinal)

{
  int iVar1;
  int iVar2;
  Gia_Rpr_t *pGVar3;
  Gia_Obj_t *pGVar4;
  Vec_Int_t *p_00;
  int *piVar5;
  int local_4c;
  int iPrev;
  int iRepr;
  int iNode;
  int k;
  int i;
  Gia_Obj_t *pObjNew;
  Gia_Obj_t *pObj;
  Vec_Int_t *vClass;
  Gia_Man_t *pFinal_local;
  Gia_Man_t *pNew_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(pFinal);
  pGVar3 = (Gia_Rpr_t *)calloc((long)iVar1,4);
  pFinal->pReprs = pGVar3;
  for (iNode = 0; iVar1 = Gia_ManObjNum(pFinal), iNode < iVar1; iNode = iNode + 1) {
    Gia_ObjSetRepr(pFinal,iNode,0xfffffff);
  }
  for (iNode = 1; iVar1 = Gia_ManObjNum(p), iNode < iVar1; iNode = iNode + 1) {
    iVar1 = Gia_ObjIsConst(p,iNode);
    if ((iVar1 != 0) && (pGVar4 = Gia_ManObj(p,iNode), pGVar4->Value != 0xffffffff)) {
      iVar1 = Abc_Lit2Var(pGVar4->Value);
      pGVar4 = Gia_ManObj(pNew,iVar1);
      iVar1 = Abc_Lit2Var(pGVar4->Value);
      if (iVar1 != 0) {
        iVar1 = Abc_Lit2Var(pGVar4->Value);
        Gia_ObjSetRepr(pFinal,iVar1,0);
      }
    }
  }
  p_00 = Vec_IntAlloc(100);
  iNode = 1;
  do {
    iVar1 = Gia_ManObjNum(p);
    if (iVar1 <= iNode) {
      Vec_IntFree(p_00);
      piVar5 = Gia_ManDeriveNexts(pFinal);
      pFinal->pNexts = piVar5;
      return;
    }
    iVar1 = Gia_ObjIsHead(p,iNode);
    if (iVar1 != 0) {
      Vec_IntClear(p_00);
      iVar1 = Gia_ObjIsHead(p,iNode);
      if (iVar1 == 0) {
        __assert_fail("Gia_ObjIsHead(p, i)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEquiv.c"
                      ,0x22e,"void Gia_ManEquivDeriveReprs(Gia_Man_t *, Gia_Man_t *, Gia_Man_t *)");
      }
      for (iRepr = iNode; iRepr != 0; iRepr = Gia_ObjNext(p,iRepr)) {
        pGVar4 = Gia_ManObj(p,iRepr);
        if (pGVar4->Value != 0xffffffff) {
          iVar1 = Abc_Lit2Var(pGVar4->Value);
          pGVar4 = Gia_ManObj(pNew,iVar1);
          iVar1 = Abc_Lit2Var(pGVar4->Value);
          Vec_IntPushUnique(p_00,iVar1);
        }
      }
      iVar1 = Vec_IntSize(p_00);
      if (1 < iVar1) {
        Vec_IntSort(p_00,0);
        iVar1 = Vec_IntEntry(p_00,0);
        local_4c = iVar1;
        for (iRepr = 1; iVar2 = Vec_IntSize(p_00), iRepr < iVar2; iRepr = iRepr + 1) {
          iVar2 = Vec_IntEntry(p_00,iRepr);
          Gia_ObjSetRepr(pFinal,iVar2,iVar1);
          if (iVar2 <= local_4c) {
            __assert_fail("iPrev < iNode",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEquiv.c"
                          ,0x23d,
                          "void Gia_ManEquivDeriveReprs(Gia_Man_t *, Gia_Man_t *, Gia_Man_t *)");
          }
          local_4c = iVar2;
        }
      }
    }
    iNode = iNode + 1;
  } while( true );
}

Assistant:

void Gia_ManEquivDeriveReprs( Gia_Man_t * p, Gia_Man_t * pNew, Gia_Man_t * pFinal )
{
    Vec_Int_t * vClass;
    Gia_Obj_t * pObj, * pObjNew;
    int i, k, iNode, iRepr, iPrev;
    // start representatives
    pFinal->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(pFinal) );
    for ( i = 0; i < Gia_ManObjNum(pFinal); i++ )
        Gia_ObjSetRepr( pFinal, i, GIA_VOID );
    // iterate over constant candidates
    Gia_ManForEachConst( p, i )
    {
        pObj = Gia_ManObj( p, i );
        if ( !~pObj->Value )
            continue;
        pObjNew = Gia_ManObj( pNew, Abc_Lit2Var(pObj->Value) );
        if ( Abc_Lit2Var(pObjNew->Value) == 0 )
            continue;
        Gia_ObjSetRepr( pFinal, Abc_Lit2Var(pObjNew->Value), 0 );
    }
    // iterate over class candidates
    vClass = Vec_IntAlloc( 100 );
    Gia_ManForEachClass( p, i )
    {
        Vec_IntClear( vClass );
        Gia_ClassForEachObj( p, i, k )
        {
            pObj = Gia_ManObj( p, k );
            if ( !~pObj->Value )
                continue;
            pObjNew = Gia_ManObj( pNew, Abc_Lit2Var(pObj->Value) );
            Vec_IntPushUnique( vClass, Abc_Lit2Var(pObjNew->Value) );
        }
        if ( Vec_IntSize( vClass ) < 2 )
            continue;
        Vec_IntSort( vClass, 0 );
        iRepr = iPrev = Vec_IntEntry( vClass, 0 );
        Vec_IntForEachEntryStart( vClass, iNode, k, 1 )
        {
            Gia_ObjSetRepr( pFinal, iNode, iRepr );
            assert( iPrev < iNode );
            iPrev = iNode;
        }
    }
    Vec_IntFree( vClass );
    pFinal->pNexts = Gia_ManDeriveNexts( pFinal );
}